

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O0

QDomNode __thiscall QDomNode::appendChild(QDomNode *this,QDomNode *newChild)

{
  undefined8 uVar1;
  QMessageLogger *in_RDX;
  long *in_RSI;
  QDomNodePrivate *in_RDI;
  long in_FS_OFFSET;
  QDomNodePrivate *pQVar2;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = in_RDI;
  if (*in_RSI == 0) {
    QMessageLogger::QMessageLogger
              (in_RDX,(char *)in_RSI,(int)((ulong)in_RDI >> 0x20),(char *)in_RDI);
    QMessageLogger::warning(local_28,"Calling appendChild() on a null node does nothing.");
    QDomNode((QDomNode *)in_RDI);
  }
  else {
    uVar1._0_4_ = (in_RDX->context).version;
    uVar1._4_4_ = (in_RDX->context).line;
    (**(code **)(*(long *)*in_RSI + 0x38))((long *)*in_RSI,uVar1);
    QDomNode((QDomNode *)pQVar2,in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QDomNode)pQVar2;
  }
  __stack_chk_fail();
}

Assistant:

QDomNode QDomNode::appendChild(const QDomNode& newChild)
{
    if (!impl) {
        qWarning("Calling appendChild() on a null node does nothing.");
        return QDomNode();
    }
    return QDomNode(IMPL->appendChild(newChild.impl));
}